

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcFunc.c
# Opt level: O2

int Abc_NtkToBdd(Abc_Ntk_t *pNtk)

{
  int iVar1;
  
  if (pNtk->ntkType != ABC_NTK_STRASH) {
    switch(pNtk->ntkFunc) {
    case ABC_FUNC_SOP:
      Abc_NtkSopToAig(pNtk);
switchD_006a44cc_caseD_3:
      iVar1 = Abc_NtkAigToBdd(pNtk);
      return iVar1;
    case ABC_FUNC_BDD:
    case ABC_FUNC_BLACKBOX:
      return 1;
    case ABC_FUNC_AIG:
      goto switchD_006a44cc_caseD_3;
    case ABC_FUNC_MAP:
      Abc_NtkMapToSop(pNtk);
      iVar1 = Abc_NtkSopToBdd(pNtk);
      return iVar1;
    default:
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcFunc.c"
                    ,0x4cb,"int Abc_NtkToBdd(Abc_Ntk_t *)");
    }
  }
  __assert_fail("!Abc_NtkIsStrash(pNtk)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcFunc.c"
                ,0x4ba,"int Abc_NtkToBdd(Abc_Ntk_t *)");
}

Assistant:

int Abc_NtkToBdd( Abc_Ntk_t * pNtk )
{
    assert( !Abc_NtkIsStrash(pNtk) );
    if ( Abc_NtkHasBlackbox(pNtk) )
        return 1;
    if ( Abc_NtkHasBdd(pNtk) )
        return 1;
    if ( Abc_NtkHasMapping(pNtk) )
    {
        Abc_NtkMapToSop(pNtk);
        return Abc_NtkSopToBdd(pNtk);
    }
    if ( Abc_NtkHasSop(pNtk) )
    {
        Abc_NtkSopToAig(pNtk);
        return Abc_NtkAigToBdd(pNtk);
    }
    if ( Abc_NtkHasAig(pNtk) )
        return Abc_NtkAigToBdd(pNtk);
    assert( 0 );
    return 0;
}